

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
GameOverIRCCommand::trigger
          (GameOverIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string_view<char,_std::char_traits<char>_> lhs_01;
  basic_string_view<char,_std::char_traits<char>_> lhs_02;
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  size_type sVar5;
  size_type sVar6;
  rep rVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  size_t local_1d8;
  char *local_1d0;
  string local_1a0;
  __sv_type local_180;
  size_t local_170;
  char *local_168;
  longlong local_160;
  rep local_158;
  int local_14c;
  rep local_148;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  size_t local_130;
  char *local_128;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  size_t local_100;
  char *local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  size_t local_e0;
  char *local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  size_t local_c0;
  char *local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  size_t local_a0;
  char *local_98;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  size_t local_80;
  char *local_78;
  long local_70;
  Server *server;
  duration<long,_std::ratio<1L,_1L>_> dStack_60;
  uint i;
  seconds delay;
  bool match;
  int type;
  Channel *chan;
  IRC_Bot *source_local;
  GameOverIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  lVar2 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
  if (lVar2 != 0) {
    delay.__r._4_4_ = Jupiter::IRC::Client::Channel::getType();
    delay.__r._3_1_ = 0;
    server._4_4_ = 0;
    while( true ) {
      uVar4 = (ulong)server._4_4_;
      RenX::getCore();
      uVar3 = RenX::Core::getServerCount();
      if (uVar4 == uVar3) break;
      uVar4 = RenX::getCore();
      local_70 = RenX::Core::getServer(uVar4);
      uVar4 = RenX::Server::isLogChanType((int)local_70);
      if ((uVar4 & 1) != 0) {
        delay.__r._3_1_ = 1;
        local_80 = parameters._M_len;
        local_78 = parameters._M_str;
        local_90 = sv("empty",5);
        bVar8._M_str = local_78;
        bVar8._M_len = local_80;
        bVar1 = jessilib::equalsi<char,char>(bVar8,local_90);
        if (bVar1) {
          RenX::Server::gameoverWhenEmpty();
        }
        else {
          local_a0 = parameters._M_len;
          local_98 = parameters._M_str;
          local_b0 = sv("if empty",8);
          lhs_02._M_str = local_98;
          lhs_02._M_len = local_a0;
          bVar1 = jessilib::equalsi<char,char>(lhs_02,local_b0);
          if (bVar1) {
            sVar5 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                              ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                               (local_70 + 0x10));
            sVar6 = RenX::Server::getBotCount();
            if (sVar5 == sVar6) {
              RenX::Server::gameover();
            }
          }
          else {
            local_c0 = parameters._M_len;
            local_b8 = parameters._M_str;
            local_d0 = sv("now",3);
            lhs_01._M_str = local_b8;
            lhs_01._M_len = local_c0;
            bVar1 = jessilib::equalsi<char,char>(lhs_01,local_d0);
            if (bVar1) {
              RenX::Server::gameover();
            }
            else {
              local_e0 = parameters._M_len;
              local_d8 = parameters._M_str;
              local_f0 = sv("stop",4);
              lhs_00._M_str = local_d8;
              lhs_00._M_len = local_e0;
              bVar1 = jessilib::equalsi<char,char>(lhs_00,local_f0);
              if (!bVar1) {
                local_100 = parameters._M_len;
                local_f8 = parameters._M_str;
                local_110 = sv("cancel",6);
                lhs._M_str = local_f8;
                lhs._M_len = local_100;
                bVar1 = jessilib::equalsi<char,char>(lhs,local_110);
                if (!bVar1) {
                  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
                  if (bVar1) {
                    local_14c = 10;
                    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                              ((duration<long,std::ratio<1l,1l>> *)&local_148,&local_14c);
                    dStack_60.__r = local_148;
                  }
                  else {
                    local_170 = parameters._M_len;
                    local_168 = parameters._M_str;
                    local_160 = Jupiter::from_string<long_long>(parameters);
                    std::chrono::duration<long,std::ratio<1l,1l>>::duration<long_long,void>
                              ((duration<long,std::ratio<1l,1l>> *)&local_158,&local_160);
                    dStack_60.__r = local_158;
                  }
                  lVar2 = local_70;
                  rVar7 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                                    (&stack0xffffffffffffffa0);
                  string_printf_abi_cxx11_
                            (&local_1a0,"Notice: This server will gameover in %lld seconds.",rVar7);
                  local_180 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)&local_1a0);
                  RenX::Server::sendMessage(lVar2,local_180._M_len,local_180._M_str);
                  std::__cxx11::string::~string((string *)&local_1a0);
                  RenX::Server::gameover(local_70,dStack_60.__r);
                  goto LAB_00148efc;
                }
              }
              uVar4 = RenX::Server::gameoverStop();
              lVar2 = local_70;
              if ((uVar4 & 1) == 0) {
                local_130 = nick._M_len;
                local_128 = nick._M_str;
                local_140 = sv("Error: There is no gameover scheduled.",0x26);
                Jupiter::IRC::Client::sendNotice
                          (source,local_130,local_128,local_140._M_len,local_140._M_str);
              }
              else {
                local_120 = sv("Notice: The scheduled gameover has been cancelled.",0x32);
                RenX::Server::sendMessage(lVar2,local_120._M_len,local_120._M_str);
              }
            }
          }
        }
      }
LAB_00148efc:
      server._4_4_ = server._4_4_ + 1;
    }
    if ((delay.__r._3_1_ & 1) == 0) {
      bVar8 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
      local_1d8 = bVar8._M_len;
      local_1d0 = bVar8._M_str;
      Jupiter::IRC::Client::sendMessage(source,channel._M_len,channel._M_str,local_1d8,local_1d0);
    }
  }
  return;
}

Assistant:

void GameOverIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		bool match = false;
		std::chrono::seconds delay;

		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				match = true;
				if (jessilib::equalsi(parameters, "empty"sv))
					server->gameoverWhenEmpty();
				else if (jessilib::equalsi(parameters, "if empty"sv))
				{
					if (server->players.size() == server->getBotCount())
						server->gameover();
				}
				else if (jessilib::equalsi(parameters, "now"sv))
					server->gameover();
				else if (jessilib::equalsi(parameters, "stop"sv) || jessilib::equalsi(parameters, "cancel"sv))
				{
					if (server->gameoverStop())
						server->sendMessage("Notice: The scheduled gameover has been cancelled."sv);
					else
						source->sendNotice(nick, "Error: There is no gameover scheduled."sv);
				}
				else
				{
					if (parameters.empty())
						delay = std::chrono::seconds(10);
					else
						delay = std::chrono::seconds(Jupiter::from_string<long long>(parameters));

					server->sendMessage(string_printf("Notice: This server will gameover in %lld seconds.", static_cast<long long>(delay.count())));
					server->gameover(delay);
				}
			}
		}
		if (match == false)
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}